

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O2

void dec_update_map(com_core_t *core)

{
  s16 (*paasVar1) [2] [2];
  u8 uVar2;
  s8 asVar3 [2];
  s8 (*pasVar4) [2];
  com_scu_t *pcVar5;
  byte bVar6;
  s16 asVar7 [2];
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  s16 (*paasVar12) [2] [2];
  byte bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int w_sch_2;
  uint uVar20;
  uint uVar21;
  s32 (*paasVar22) [1024] [2];
  uint uVar23;
  uint uVar24;
  s32 (*paasVar25) [1024] [2];
  int iVar26;
  s16 (*pasVar27) [2];
  com_scu_t cVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  ushort uVar32;
  uint uVar33;
  int iVar34;
  s16 asVar35 [2];
  long lVar36;
  byte bVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  s8 (*pasVar46) [2];
  int iVar47;
  int iVar48;
  ulong uVar49;
  int w_sch_1;
  int iVar50;
  uint uVar51;
  uint uVar52;
  long lVar53;
  com_scu_t *__s;
  int w_sch;
  uint uVar54;
  uint uVar55;
  s16 aasVar56 [2] [2];
  s16 (*local_130) [2] [2];
  s32 (*local_118) [1024] [2];
  s16 (*local_110) [2] [2];
  u32 *local_100;
  uint local_9c;
  
  uVar21 = core->cu_log2w - 2;
  uVar20 = 1 << ((byte)uVar21 & 0x1f);
  iVar8 = 1 << ((char)core->cu_log2h - 2U & 0x1f);
  lVar53 = (long)core->cu_scup;
  pasVar4 = (core->map).map_refi;
  pcVar5 = (core->map).map_scu;
  bVar37 = (core->cu_mode != 0) * '\x02' + 3;
  bVar13 = 0x10;
  if ((*(int *)core->cbfy == 0) && (*(short *)core->cbfc == 0)) {
    bVar13 = bVar37 * '\b' & 0x10;
  }
  asVar3 = *&core->refi;
  iVar30 = core->seqhdr->i_scu;
  lVar36 = (long)iVar30;
  pasVar46 = pasVar4 + lVar53;
  local_100 = (core->map).map_pos + lVar53;
  __s = pcVar5 + lVar53;
  cVar28 = (com_scu_t)((core->cu_mode == 2) << 3 | (core->affine_flag & 3) << 5 | bVar13 | bVar37);
  uVar33 = core->cu_scup << 6 | (core->cu_log2w & 7U) + (core->cu_log2h & 7U) * 8;
  if (core->affine_flag == 0) {
    paasVar12 = (core->map).map_mv;
    if (uVar21 < 2) {
      if (uVar21 == 1) {
        aasVar56 = *&core->mv;
        iVar30 = 0;
        if (0 < iVar8) {
          iVar30 = iVar8;
        }
        while (iVar30 != 0) {
          *(ushort *)__s = (ushort)(byte)cVar28 * 0x101;
          *(uint *)(pasVar4 + lVar53) = (uint)(ushort)asVar3 * 0x10001;
          paasVar12[lVar53] = aasVar56;
          paasVar12[lVar53 + 1] = aasVar56;
          local_100[uVar20 - 1] = uVar33;
          __s = __s + lVar36;
          local_100 = local_100 + lVar36;
          lVar53 = lVar53 + lVar36;
          iVar30 = iVar30 + -1;
        }
      }
      else {
        iVar30 = 0;
        if (0 < iVar8) {
          iVar30 = iVar8;
        }
        while (iVar30 != 0) {
          pcVar5[lVar53] = cVar28;
          pasVar4[lVar53] = asVar3;
          paasVar12[lVar53] = *&core->mv;
          *local_100 = uVar33;
          lVar53 = lVar53 + lVar36;
          local_100 = local_100 + lVar36;
          iVar30 = iVar30 + -1;
        }
      }
    }
    else {
      paasVar12 = paasVar12 + lVar53;
      iVar30 = 0;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      asVar35 = core->mv[0];
      asVar7 = core->mv[1];
      for (; iVar30 != iVar8; iVar30 = iVar30 + 1) {
        for (lVar53 = 0; lVar53 < (int)uVar20; lVar53 = lVar53 + 4) {
          *(uint *)(__s + lVar53) = (uint)(byte)cVar28 * 0x1010101;
          *(ulong *)(pasVar46 + lVar53) = (ulong)(ushort)asVar3 * 0x1000100010001;
          paasVar1 = paasVar12 + lVar53 + 2;
          (*paasVar1)[0] = asVar35;
          (*paasVar1)[1] = asVar7;
          paasVar1[1][0] = asVar35;
          paasVar1[1][1] = asVar7;
          paasVar1 = paasVar12 + lVar53;
          (*paasVar1)[0] = asVar35;
          (*paasVar1)[1] = asVar7;
          paasVar1[1][0] = asVar35;
          paasVar1[1][1] = asVar7;
        }
        local_100[(int)(uVar20 - 1)] = uVar33;
        local_100 = local_100 + lVar36;
        paasVar12 = paasVar12 + lVar36;
        pasVar46 = pasVar46 + lVar36;
        __s = __s + lVar36;
      }
    }
  }
  else {
    iVar26 = 0;
    uVar19 = 0;
    if (0 < (int)uVar20) {
      uVar19 = (ulong)uVar20;
    }
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    for (; iVar26 != iVar8; iVar26 = iVar26 + 1) {
      memset(__s,(uint)(byte)cVar28,(long)(int)uVar20);
      for (uVar11 = 0; uVar19 != uVar11; uVar11 = uVar11 + 1) {
        pasVar46[uVar11] = asVar3;
      }
      local_100[(int)(uVar20 - 1)] = uVar33;
      local_100 = local_100 + lVar36;
      __s = __s + lVar36;
      pasVar46 = pasVar46 + lVar36;
    }
    bVar13 = (byte)core->cu_log2w;
    uVar54 = (1 << (bVar13 & 0x1f)) >> 2;
    bVar37 = (byte)core->cu_log2h;
    uVar21 = (1 << (bVar37 & 0x1f)) >> 2;
    uVar2 = core->affine_flag;
    if (core->refi[0] < '\0') {
      local_130 = (core->map).map_mv;
    }
    else {
      local_130 = (core->map).map_mv;
      if (-1 < core->refi[1]) {
        iVar8 = core->affine_mv[0][0][0];
        iVar26 = core->affine_mv[0][0][1];
        uVar14 = iVar8 * 0x80;
        uVar15 = iVar26 * 0x80;
        iVar34 = (core->affine_mv[0][1][0] - iVar8) * 0x80 >> (bVar13 & 0x1f);
        iVar43 = (core->affine_mv[0][1][1] - iVar26) * 0x80 >> (bVar13 & 0x1f);
        iVar9 = core->affine_mv[1][0][0];
        uVar16 = iVar9 * 0x80;
        iVar48 = core->affine_mv[1][0][1];
        uVar17 = iVar48 * 0x80;
        iVar47 = (core->affine_mv[1][1][0] - iVar9) * 0x80 >> (bVar13 & 0x1f);
        iVar50 = (core->affine_mv[1][1][1] - iVar48) * 0x80 >> (bVar13 & 0x1f);
        if (uVar2 == '\x02') {
          iVar38 = (core->affine_mv[0][2][0] - iVar8) * 0x80 >> (bVar37 & 0x1f);
          iVar8 = (core->affine_mv[0][2][1] - iVar26) * 0x80 >> (bVar37 & 0x1f);
          iVar9 = (core->affine_mv[1][2][0] - iVar9) * 0x80 >> (bVar37 & 0x1f);
          iVar26 = (core->affine_mv[1][2][1] - iVar48) * 0x80 >> (bVar37 & 0x1f);
        }
        else {
          iVar38 = -iVar43;
          iVar9 = -iVar50;
          iVar8 = iVar34;
          iVar26 = iVar47;
        }
        local_110 = local_130 + lVar53;
        local_118 = core->affine_sb_mv;
        paasVar25 = core->affine_sb_mv + 1;
        local_130 = local_130 + lVar53 + lVar36 + 1;
        uVar51 = uVar17 + iVar26 * 4 + iVar50 * 4;
        uVar42 = uVar16 + iVar9 * 4 + iVar47 * 4;
        uVar40 = uVar15 + iVar8 * 4 + iVar43 * 4;
        local_9c = uVar14 + iVar38 * 4 + iVar34 * 4;
        uVar44 = 0;
        while ((int)uVar44 < (int)uVar21) {
          lVar29 = 0;
          uVar52 = uVar51;
          uVar39 = uVar40;
          uVar41 = uVar42;
          uVar31 = local_9c;
          for (lVar53 = 0; lVar53 < (int)uVar54; lVar53 = lVar53 + 2) {
            uVar10 = uVar14;
            uVar24 = uVar15;
            uVar23 = uVar16;
            uVar45 = uVar17;
            if ((uVar44 != 0 || (int)lVar53 != 0) &&
               (((uVar44 != 0 ||
                 (uVar10 = (iVar34 << (bVar13 & 0x1f)) + uVar14,
                 uVar24 = (iVar43 << (bVar13 & 0x1f)) + uVar15,
                 uVar23 = (iVar47 << (bVar13 & 0x1f)) + uVar16,
                 uVar45 = (iVar50 << (bVar13 & 0x1f)) + uVar17, (ulong)uVar54 - 2 != lVar53)) &&
                (uVar10 = (iVar38 << (bVar37 & 0x1f)) + uVar14,
                uVar24 = (iVar8 << (bVar37 & 0x1f)) + uVar15,
                uVar23 = (iVar9 << (bVar37 & 0x1f)) + uVar16,
                uVar45 = (iVar26 << (bVar37 & 0x1f)) + uVar17,
                lVar53 != 0 || (uVar44 + 2 != uVar21 || uVar2 != '\x02'))))) {
              uVar10 = uVar31;
              uVar24 = uVar39;
              uVar23 = uVar41;
              uVar45 = uVar52;
            }
            uVar18 = 0;
            uVar55 = 0;
            if (uVar10 != 0) {
              if ((int)uVar10 < 1) {
                uVar10 = 0x40 - uVar10 >> 7;
                uVar18 = -uVar10;
                if ((int)uVar18 < -0x1ffff) {
                  uVar18 = 0xfffe0000;
                }
                uVar55 = -(uVar10 + 2 >> 2);
                if ((int)uVar55 < -0x7fff) {
                  uVar55 = 0xffff8000;
                }
              }
              else {
                uVar18 = uVar10 + 0x40 >> 7;
                if (0xffffbf < uVar10) {
                  uVar18 = 0x1ffff;
                }
                uVar55 = uVar18 + 2 >> 2;
                if (0x7ffe < uVar55) {
                  uVar55 = 0x7fff;
                }
              }
            }
            uVar19 = (ulong)uVar18;
            uVar10 = 0;
            if (uVar24 != 0) {
              if ((int)uVar24 < 1) {
                uVar10 = 0x40 - uVar24 >> 7;
                uVar24 = -uVar10;
                uVar11 = (ulong)uVar24;
                if ((int)uVar24 < -0x1ffff) {
                  uVar11 = 0xfffe0000;
                }
                uVar19 = uVar19 | uVar11 << 0x20;
                uVar10 = -(uVar10 + 2 >> 2);
                if ((int)uVar10 < -0x7fff) {
                  uVar10 = 0xffff8000;
                }
              }
              else {
                uVar10 = uVar24 + 0x40 >> 7;
                if (0xffffbf < uVar24) {
                  uVar10 = 0x1ffff;
                }
                uVar19 = CONCAT44(uVar10,uVar18);
                uVar10 = uVar10 + 2 >> 2;
                if (0x7ffe < uVar10) {
                  uVar10 = 0x7fff;
                }
              }
            }
            uVar11 = 0;
            uVar24 = 0;
            uVar18 = 0;
            if (uVar23 != 0) {
              if ((int)uVar23 < 1) {
                uVar23 = 0x40 - uVar23 >> 7;
                uVar24 = -uVar23;
                if ((int)uVar24 < -0x1ffff) {
                  uVar24 = 0xfffe0000;
                }
                uVar18 = -(uVar23 + 2 >> 2);
                if ((int)uVar18 < -0x7fff) {
                  uVar18 = 0xffff8000;
                }
              }
              else {
                uVar24 = uVar23 + 0x40 >> 7;
                if (0xffffbf < uVar23) {
                  uVar24 = 0x1ffff;
                }
                uVar18 = uVar24 + 2 >> 2;
                if (0x7ffe < uVar18) {
                  uVar18 = 0x7fff;
                }
              }
            }
            uVar49 = (ulong)uVar24;
            if (uVar45 != 0) {
              if ((int)uVar45 < 1) {
                uVar24 = 0x40 - uVar45 >> 7;
                uVar23 = -uVar24;
                uVar11 = (ulong)uVar23;
                if ((int)uVar23 < -0x1ffff) {
                  uVar11 = 0xfffe0000;
                }
                uVar49 = uVar49 | uVar11 << 0x20;
                uVar24 = -(uVar24 + 2 >> 2);
                uVar11 = (ulong)uVar24;
                if ((int)uVar24 < -0x7fff) {
                  uVar11 = 0xffff8000;
                }
              }
              else {
                uVar23 = uVar45 + 0x40 >> 7;
                if (0xffffbf < uVar45) {
                  uVar23 = 0x1ffff;
                }
                uVar49 = CONCAT44(uVar23,uVar24);
                uVar24 = uVar23 + 2 >> 2;
                if (0x7ffe < uVar24) {
                  uVar24 = 0x7fff;
                }
                uVar11 = (ulong)uVar24;
              }
            }
            aasVar56 = (s16  [2] [2])
                       ((ulong)(uVar55 & 0xffff) |
                       (ulong)(uVar10 << 0x10) | (ulong)(uVar18 & 0xffff) << 0x20 | uVar11 << 0x30);
            local_110[lVar53] = aasVar56;
            local_110[lVar53 + 1] = aasVar56;
            local_130[lVar53 + -1] = aasVar56;
            local_130[lVar53] = aasVar56;
            *(ulong *)((*local_118)[0] + lVar53) = uVar19;
            *(ulong *)((*paasVar25)[0] + lVar53) = uVar49;
            uVar52 = uVar52 + iVar50 * 8;
            uVar41 = uVar41 + iVar47 * 8;
            uVar39 = uVar39 + iVar43 * 8;
            uVar31 = uVar31 + iVar34 * 8;
            lVar29 = lVar29 + -8;
          }
          local_130 = local_130 + iVar30 * 2;
          local_110 = local_110 + iVar30 * 2;
          uVar51 = uVar51 + iVar26 * 8;
          uVar42 = uVar42 + iVar9 * 8;
          uVar40 = uVar40 + iVar8 * 8;
          local_9c = local_9c + iVar38 * 8;
          paasVar25 = (s32 (*) [1024] [2])((long)paasVar25 - lVar29);
          local_118 = (s32 (*) [1024] [2])((long)local_118 - lVar29);
          uVar44 = uVar44 + 2;
        }
        goto LAB_0010b523;
      }
    }
    bVar6 = (byte)core->refi[0] >> 7;
    iVar8 = core->affine_mv[bVar6][0][0];
    iVar9 = (core->affine_mv[bVar6][1][0] - iVar8) * 0x80 >> (bVar13 & 0x1f);
    iVar26 = core->affine_mv[bVar6][0][1];
    iVar48 = (core->affine_mv[bVar6][1][1] - iVar26) * 0x80 >> (bVar13 & 0x1f);
    if (uVar2 == '\x02') {
      iVar43 = (core->affine_mv[bVar6][2][0] - iVar8) * 0x80 >> (bVar37 & 0x1f);
      iVar34 = (core->affine_mv[bVar6][2][1] - iVar26) * 0x80 >> (bVar37 & 0x1f);
    }
    else {
      iVar43 = -iVar48;
      iVar34 = iVar9;
    }
    paasVar25 = core->affine_sb_mv + bVar6;
    uVar15 = iVar8 * 0x80;
    uVar14 = iVar26 * 0x80;
    if (core->pichdr->affine_subblock_size_idx == 1) {
      lVar29 = (long)local_130[1][0] + (lVar36 * 8 + lVar53 * 8 | (ulong)bVar6 * 4);
      pasVar27 = local_130[lVar53 + 1] + bVar6;
      uVar42 = uVar14 + iVar34 * 4 + iVar48 * 4;
      uVar16 = uVar15 + iVar43 * 4 + iVar9 * 4;
      uVar17 = 0;
      while ((int)uVar17 < (int)uVar21) {
        paasVar22 = paasVar25;
        uVar44 = uVar42;
        uVar40 = uVar16;
        for (lVar53 = 0; lVar53 < (int)uVar54; lVar53 = lVar53 + 2) {
          uVar51 = uVar15;
          uVar31 = uVar14;
          if (((uVar17 != 0 || (int)lVar53 != 0) &&
              ((uVar17 != 0 ||
               (uVar51 = (iVar9 << (bVar13 & 0x1f)) + uVar15,
               uVar31 = (iVar48 << (bVar13 & 0x1f)) + uVar14, (ulong)uVar54 - 2 != lVar53)))) &&
             (uVar51 = (iVar43 << (bVar37 & 0x1f)) + uVar15,
             uVar31 = (iVar34 << (bVar37 & 0x1f)) + uVar14,
             (uVar17 + 2 != uVar21 || uVar2 != '\x02') || lVar53 != 0)) {
            uVar51 = uVar40;
            uVar31 = uVar44;
          }
          uVar32 = 0;
          uVar39 = 0;
          if (uVar51 != 0) {
            if ((int)uVar51 < 1) {
              uVar51 = 0x40 - uVar51 >> 7;
              uVar39 = -uVar51;
              if ((int)uVar39 < -0x1ffff) {
                uVar39 = 0xfffe0000;
              }
              iVar8 = -(uVar51 + 2 >> 2);
              uVar32 = (ushort)iVar8;
              if (iVar8 < -0x7fff) {
                uVar32 = 0x8000;
              }
            }
            else {
              uVar39 = uVar51 + 0x40 >> 7;
              if (0xffffbf < uVar51) {
                uVar39 = 0x1ffff;
              }
              uVar51 = uVar39 + 2 >> 2;
              if (0x7ffe < uVar51) {
                uVar51 = 0x7fff;
              }
              uVar32 = (ushort)uVar51;
            }
          }
          uVar19 = 0;
          uVar51 = 0;
          if (uVar31 != 0) {
            if ((int)uVar31 < 1) {
              uVar31 = 0x40 - uVar31 >> 7;
              uVar51 = -uVar31;
              if ((int)uVar51 < -0x1ffff) {
                uVar51 = 0xfffe0000;
              }
              uVar19 = (ulong)uVar51;
              uVar51 = -(uVar31 + 2 >> 2);
              if ((int)uVar51 < -0x7fff) {
                uVar51 = 0xffff8000;
              }
            }
            else {
              uVar51 = uVar31 + 0x40 >> 7;
              if (0xffffbf < uVar31) {
                uVar51 = 0x1ffff;
              }
              uVar19 = (ulong)uVar51;
              uVar51 = uVar51 + 2 >> 2;
              if (0x7ffe < uVar51) {
                uVar51 = 0x7fff;
              }
            }
          }
          asVar35 = (s16  [2])((uint)uVar32 | uVar51 << 0x10);
          pasVar27[lVar53 * 2 + -2] = asVar35;
          pasVar27[lVar53 * 2] = asVar35;
          *(s16 (*) [2])(lVar29 + -8 + lVar53 * 8) = asVar35;
          *(s16 (*) [2])(lVar29 + lVar53 * 8) = asVar35;
          paasVar22 = (s32 (*) [1024] [2])(*paasVar22 + 1);
          *(ulong *)((*paasVar25)[0] + lVar53) = (ulong)uVar39 | uVar19 << 0x20;
          uVar44 = uVar44 + iVar48 * 8;
          uVar40 = uVar40 + iVar9 * 8;
        }
        lVar29 = lVar29 + (long)(iVar30 * 2) * 8;
        pasVar27 = pasVar27 + (long)(iVar30 * 2) * 2;
        uVar42 = uVar42 + iVar34 * 8;
        uVar16 = uVar16 + iVar43 * 8;
        paasVar25 = paasVar22;
        uVar17 = uVar17 + 2;
      }
    }
    else {
      uVar17 = uVar21 - 1;
      uVar42 = 0;
      uVar16 = uVar54;
      if ((int)uVar54 < 1) {
        uVar16 = uVar42;
      }
      if ((int)uVar21 < 1) {
        uVar21 = 0;
      }
      pasVar27 = local_130[lVar53] + bVar6;
      uVar40 = uVar15 + iVar43 * 2 + iVar9 * 2;
      uVar44 = uVar14 + iVar34 * 2 + iVar48 * 2;
      for (; uVar42 != uVar21; uVar42 = uVar42 + 1) {
        uVar31 = uVar44;
        uVar51 = uVar40;
        for (uVar19 = 0; uVar16 != uVar19; uVar19 = uVar19 + 1) {
          uVar39 = uVar15;
          uVar41 = uVar14;
          if (((uVar42 != 0 || (int)uVar19 != 0) &&
              ((uVar42 != 0 ||
               (uVar39 = (iVar9 << (bVar13 & 0x1f)) + uVar15,
               uVar41 = (iVar48 << (bVar13 & 0x1f)) + uVar14, uVar54 - 1 != uVar19)))) &&
             (uVar39 = (iVar43 << (bVar37 & 0x1f)) + uVar15,
             uVar41 = (iVar34 << (bVar37 & 0x1f)) + uVar14,
             (uVar42 != uVar17 || uVar2 != '\x02') || uVar19 != 0)) {
            uVar39 = uVar51;
            uVar41 = uVar31;
          }
          uVar52 = 0;
          uVar32 = 0;
          uVar11 = 0;
          if (uVar39 != 0) {
            if ((int)uVar39 < 1) {
              uVar10 = 0x40 - uVar39 >> 7;
              uVar39 = -uVar10;
              if ((int)uVar39 < -0x1ffff) {
                uVar39 = 0xfffe0000;
              }
              uVar11 = (ulong)uVar39;
              iVar8 = -(uVar10 + 2 >> 2);
              uVar32 = (ushort)iVar8;
              if (iVar8 < -0x7fff) {
                uVar32 = 0x8000;
              }
            }
            else {
              uVar10 = uVar39 + 0x40 >> 7;
              if (0xffffbf < uVar39) {
                uVar10 = 0x1ffff;
              }
              uVar11 = (ulong)uVar10;
              uVar39 = uVar10 + 2 >> 2;
              if (0x7ffe < uVar39) {
                uVar39 = 0x7fff;
              }
              uVar32 = (ushort)uVar39;
            }
          }
          uVar49 = 0;
          if (uVar41 != 0) {
            if ((int)uVar41 < 1) {
              uVar41 = 0x40 - uVar41 >> 7;
              uVar39 = -uVar41;
              if ((int)uVar39 < -0x1ffff) {
                uVar39 = 0xfffe0000;
              }
              uVar49 = (ulong)uVar39;
              uVar52 = -(uVar41 + 2 >> 2);
              if ((int)uVar52 < -0x7fff) {
                uVar52 = 0xffff8000;
              }
            }
            else {
              uVar39 = uVar41 + 0x40 >> 7;
              if (0xffffbf < uVar41) {
                uVar39 = 0x1ffff;
              }
              uVar49 = (ulong)uVar39;
              uVar52 = uVar39 + 2 >> 2;
              if (0x7ffe < uVar52) {
                uVar52 = 0x7fff;
              }
            }
          }
          pasVar27[uVar19 * 2] = (s16  [2])((uint)uVar32 | uVar52 << 0x10);
          (*paasVar25)[0] = (s32  [2])(uVar11 | uVar49 << 0x20);
          paasVar25 = (s32 (*) [1024] [2])(*paasVar25 + 1);
          uVar51 = uVar51 + iVar9 * 4;
          uVar31 = uVar31 + iVar48 * 4;
        }
        pasVar27 = pasVar27 + lVar36 * 2;
        uVar40 = uVar40 + iVar43 * 4;
        uVar44 = uVar44 + iVar34 * 4;
      }
    }
  }
LAB_0010b523:
  uVar11 = 0;
  uVar19 = (ulong)uVar20;
  if ((int)uVar20 < 1) {
    uVar19 = uVar11;
  }
  for (; uVar19 != uVar11; uVar11 = uVar11 + 1) {
    local_100[uVar11 - lVar36] = uVar33;
  }
  return;
}

Assistant:

void dec_update_map(com_core_t * core)
{
    int i, j;
    int scup  = core->cu_scup;
    int i_scu = core->seqhdr->i_scu;
    int w_cu = 1 << (core->cu_log2w - MIN_CU_LOG2);
    int h_cu = 1 << (core->cu_log2h - MIN_CU_LOG2);
    s8  (*map_refi)[REFP_NUM]       = core->map.map_refi + scup;
    s16 (*map_mv)  [REFP_NUM][MV_D] = core->map.map_mv   + scup;
    u32  *map_pos                   = core->map.map_pos  + scup;
    com_scu_t *map_scu              = core->map.map_scu  + scup;
    u32 cu_pos = 0;
    com_scu_t scu = { 0 };
    s16 (*mv)[MV_D] = core->mv;
    u16 refi = M16(core->refi);
    
    scu.coded  = 1;
    scu.intra  = core->cu_mode == MODE_INTRA;
    scu.inter  = !scu.intra;
    scu.affine = core->affine_flag;
    scu.skip   = core->cu_mode == MODE_SKIP;
    scu.cbf = M32(core->cbfy) || M16(core->cbfc) || scu.intra; // only used for deblock

    MCU_SET_LOGW(cu_pos, core->cu_log2w);
    MCU_SET_LOGH(cu_pos, core->cu_log2h);
    MCU_SET_SCUP(cu_pos, core->cu_scup);

    if (core->affine_flag) {
        for (i = 0; i < h_cu; i++) {
            memset(map_scu, *(u8*)&scu, w_cu);
            for (j = 0; j < w_cu; j++) {
                M16(map_refi[j]) = refi;
            }
            map_pos[w_cu - 1] = cu_pos;
            map_refi += i_scu;
            map_mv   += i_scu;
            map_pos  += i_scu;
            map_scu  += i_scu;
        }
        set_affine_mvf(core, scup, core->cu_log2w, core->cu_log2h, i_scu, &core->map, core->pichdr);
    } else {
        if ((w_cu & 3) == 0) {
            u64 refi_64 = refi * 0x0001000100010001;
            u32 scu_32 = (*(u8*)&scu) * 0x01010101;
            uavs3d_union128_t mv_128 = { M64(mv), M64(mv) };

            for (i = 0; i < h_cu; i++) {
                for (j = 0; j < w_cu; j += 4) {
                    M32(map_scu + j) = scu_32;
                    M64(map_refi + j) = refi_64;
                    CP128(map_mv + j, &mv_128);
                    CP128(map_mv + j + 2, &mv_128);
                }
                map_pos[w_cu - 1] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        } else if ((w_cu & 1) == 0) {
            u32 refi_32 = refi * 0x00010001;
            u16 scu_16 = (*(u8*)&scu) * 0x0101;
            uavs3d_union128_t mv_128 = { M64(mv), M64(mv) };

            for (i = 0; i < h_cu; i++) {
                M16(map_scu) = scu_16;
                M32(map_refi) = refi_32;
                CP128(map_mv, &mv_128);
                map_pos[w_cu - 1] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        } else {
            for (i = 0; i < h_cu; i++) {
                *map_scu = scu;
                M16(map_refi) = refi;
                CP64(map_mv, mv);
                map_pos[0] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        }
    }

    map_pos -= i_scu;

    for (j = 0; j < w_cu; j++) {
        map_pos[j] = cu_pos;
    }
}